

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void prepare_enc_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers)

{
  EncQuantDequantParams *pEVar1;
  long lVar2;
  int16_t iVar3;
  int16_t iVar4;
  int16_t iVar5;
  _Bool _Var6;
  long lVar7;
  AV1_COMP *cpi_00;
  void *pvVar8;
  int in_EDX;
  undefined8 in_RSI;
  AV1_PRIMARY *in_RDI;
  int j_1;
  int j;
  int y;
  int x;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  AV1_COMMON *cm;
  MultiThreadInfo *mt_info;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_2c;
  
  for (local_2c = in_EDX + -1; -1 < local_2c; local_2c = local_2c + -1) {
    lVar7 = in_RDI[7].twopass.kf_group_bits + (long)local_2c * 0x38;
    cpi_00 = (AV1_COMP *)((long)in_RDI[7].twopass.kf_group_error_left + (long)local_2c * 0x1d0);
    *(undefined8 *)(lVar7 + 0x18) = in_RSI;
    *(AV1_COMP **)(lVar7 + 0x20) = cpi_00;
    *(undefined8 *)(lVar7 + 0x28) = 0;
    *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x1b] + 6) = local_2c;
    *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x1b] + 4) = local_2c;
    cpi_00->ppi = in_RDI;
    if (local_2c == 0) {
      *(FRAME_UPDATE_TYPE **)&cpi_00->field_0x8 = in_RDI[1].gf_group.update_type + 0x68;
    }
    else {
      pEVar1 = &cpi_00->enc_quant_dequant_params;
      iVar3 = *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 2);
      iVar4 = *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 4);
      iVar5 = *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 6);
      *(int16_t *)&cpi_00->field_0x8 = *(int16_t *)((long)((pEVar1->quants).y_quant + 0) + 0);
      *(int16_t *)&cpi_00->field_0xa = iVar3;
      *(int16_t *)&cpi_00->field_0xc = iVar4;
      *(int16_t *)&cpi_00->field_0xe = iVar5;
    }
    *(undefined4 *)(*(long *)&cpi_00->field_0x8 + 0x25d50) = 0;
    *(undefined4 *)(*(long *)&cpi_00->field_0x8 + 0x25d54) = 0;
    *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x25d30) = 0;
    *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x25c48) = 0;
    *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x25c50) = 0;
    if (*(undefined1 **)&cpi_00->field_0x8 != in_RDI[1].gf_group.update_type + 0x68) {
      memcpy(*(void **)&cpi_00->field_0x8,in_RDI[1].gf_group.update_type + 0x68,0x256b0);
      memcpy((void *)(*(long *)&cpi_00->field_0x8 + 0x256c0),
             in_RDI[2].tpl_data.tpl_rec_pool[0x12].store_buf_adr,0x598);
      lVar7 = *(long *)&cpi_00->field_0x8;
      lVar2 = *(long *)&cpi_00->field_0x8;
      *(undefined8 *)(lVar7 + 0x41a0) = *(undefined8 *)(lVar2 + 0x25cd8);
      *(undefined8 *)(lVar7 + 0x41a8) = *(undefined8 *)(lVar2 + 0x25ce0);
      *(undefined8 *)(lVar7 + 0x41b0) = *(undefined8 *)(lVar2 + 0x25ce8);
      *(undefined8 *)(lVar7 + 0x41b8) = *(undefined8 *)(lVar2 + 0x25cf0);
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < 2;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < 2;
            in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
          memcpy(*(void **)(*(long *)&cpi_00->field_0x8 + 0x25cb8 +
                            (long)in_stack_ffffffffffffffbc * 0x10 +
                           (long)in_stack_ffffffffffffffb8 * 8),
                 (void *)(&in_RDI[2].p_rc.regions[0x67].avg_noise_var)
                         [(long)in_stack_ffffffffffffffbc * 2 + (long)in_stack_ffffffffffffffb8],
                 0x4000);
          *(undefined8 *)
           (*(long *)&cpi_00->field_0x8 + 0x1ee58 + (long)in_stack_ffffffffffffffbc * 0x10 +
           (long)in_stack_ffffffffffffffb8 * 8) =
               *(undefined8 *)
                (*(long *)&cpi_00->field_0x8 + 0x25cb8 + (long)in_stack_ffffffffffffffbc * 0x10 +
                (long)in_stack_ffffffffffffffb8 * 8);
        }
      }
      if (*(int *)&in_RDI[4].fn_ptr[0x14].ovf != 0) {
        pvVar8 = aom_malloc(0x250b6b);
        *(void **)(*(long *)&cpi_00->field_0x8 + 0x256b0) = pvVar8;
        if (*(long *)(*(long *)&cpi_00->field_0x8 + 0x256b0) == 0) {
          aom_internal_error(*(aom_internal_error_info **)&in_RDI[2].tpl_data.tpl_mt_sync.sync_range
                             ,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate thread_data->td->mv_costs_alloc");
        }
        *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0xb9c8) =
             *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x256b0);
        memcpy(*(void **)(*(long *)&cpi_00->field_0x8 + 0xb9c8),
               *(void **)(in_RDI[1].p_rc.q_history + 0x396),0x80028);
      }
      if (*(int *)&in_RDI[4].tpl_data.tpl_stats_buffer[0].rec_picture != 0) {
        *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0xb9d0) = 0;
        _Var6 = av1_need_dv_costs((AV1_COMP *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        if (_Var6) {
          pvVar8 = aom_malloc(0x250c3a);
          *(void **)(*(long *)&cpi_00->field_0x8 + 0x256b8) = pvVar8;
          if (*(long *)(*(long *)&cpi_00->field_0x8 + 0x256b8) == 0) {
            aom_internal_error(*(aom_internal_error_info **)
                                &in_RDI[2].tpl_data.tpl_mt_sync.sync_range,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate thread_data->td->dv_costs_alloc");
          }
          *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0xb9d0) =
               *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x256b8);
          memcpy(*(void **)(*(long *)&cpi_00->field_0x8 + 0xb9d0),
                 *(void **)(in_RDI[1].p_rc.q_history + 0x398),0x40018);
        }
      }
    }
    av1_alloc_mb_data(cpi_00,(macroblock *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    av1_init_rtc_counters((MACROBLOCK *)0x250ce9);
    *(undefined4 *)(*(long *)&cpi_00->field_0x8 + 0x25690) = 0;
    if ((uint8_t **)*(undefined1 **)(*(long *)&cpi_00->field_0x8 + 0x25c58) !=
        in_RDI[2].tpl_data.tpl_rec_pool[0x2f].store_buf_adr + 2) {
      memcpy(*(void **)(*(long *)&cpi_00->field_0x8 + 0x25c58),
             in_RDI[2].tpl_data.tpl_rec_pool[0x2f].store_buf_adr + 2,0xc0);
    }
    if (0 < local_2c) {
      *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x41c0) =
           *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x25cf8);
      memcpy((void *)(*(long *)&cpi_00->field_0x8 + 0x41c8),
             (void *)(*(long *)&cpi_00->field_0x8 + 0x25d00),0x28);
      *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x41f0) =
           *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x25d28);
      for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < 2;
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
        *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x41f8 + (long)in_stack_ffffffffffffffb4 * 8)
             = *(undefined8 *)
                (*(long *)&cpi_00->field_0x8 + 0x25d38 + (long)in_stack_ffffffffffffffb4 * 8);
      }
      *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x1f6b8) =
           *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x26e40);
      *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x25688) =
           *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x26e48);
      *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x3c58) =
           *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x41f0);
      for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < 2;
          in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
        *(undefined8 *)(*(long *)&cpi_00->field_0x8 + 0x3c60 + (long)in_stack_ffffffffffffffb0 * 8)
             = *(undefined8 *)
                (*(long *)&cpi_00->field_0x8 + 0x41f8 + (long)in_stack_ffffffffffffffb0 * 8);
      }
    }
  }
  return;
}

Assistant:

static inline void prepare_enc_workers(AV1_COMP *cpi, AVxWorkerHook hook,
                                       int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1_COMMON *const cm = &cpi->common;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    EncWorkerData *const thread_data = &mt_info->tile_thr_data[i];

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = NULL;

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    thread_data->cpi = cpi;
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
    }

    thread_data->td->intrabc_used = 0;
    thread_data->td->deltaq_used = 0;
    thread_data->td->abs_sum_level = 0;
    thread_data->td->rd_counts.seg_tmp_pred_cost[0] = 0;
    thread_data->td->rd_counts.seg_tmp_pred_cost[1] = 0;

    // Before encoding a frame, copy the thread data from cpi.
    if (thread_data->td != &cpi->td) {
      thread_data->td->mb = cpi->td.mb;
      thread_data->td->rd_counts = cpi->td.rd_counts;
      thread_data->td->mb.obmc_buffer = thread_data->td->obmc_buffer;

      for (int x = 0; x < 2; x++) {
        for (int y = 0; y < 2; y++) {
          memcpy(thread_data->td->hash_value_buffer[x][y],
                 cpi->td.mb.intrabc_hash_info.hash_value_buffer[x][y],
                 AOM_BUFFER_SIZE_FOR_BLOCK_HASH *
                     sizeof(*thread_data->td->hash_value_buffer[0][0]));
          thread_data->td->mb.intrabc_hash_info.hash_value_buffer[x][y] =
              thread_data->td->hash_value_buffer[x][y];
        }
      }
      // Keep these conditional expressions in sync with the corresponding ones
      // in accumulate_counters_enc_workers().
      if (cpi->sf.inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        CHECK_MEM_ERROR(
            cm, thread_data->td->mv_costs_alloc,
            (MvCosts *)aom_malloc(sizeof(*thread_data->td->mv_costs_alloc)));
        thread_data->td->mb.mv_costs = thread_data->td->mv_costs_alloc;
        memcpy(thread_data->td->mb.mv_costs, cpi->td.mb.mv_costs,
               sizeof(MvCosts));
      }
      if (cpi->sf.intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        // Reset dv_costs to NULL for worker threads when dv cost update is
        // enabled so that only dv_cost_upd_level needs to be checked before the
        // aom_free() call for the same.
        thread_data->td->mb.dv_costs = NULL;
        if (av1_need_dv_costs(cpi)) {
          CHECK_MEM_ERROR(cm, thread_data->td->dv_costs_alloc,
                          (IntraBCMVCosts *)aom_malloc(
                              sizeof(*thread_data->td->dv_costs_alloc)));
          thread_data->td->mb.dv_costs = thread_data->td->dv_costs_alloc;
          memcpy(thread_data->td->mb.dv_costs, cpi->td.mb.dv_costs,
                 sizeof(IntraBCMVCosts));
        }
      }
    }
    av1_alloc_mb_data(cpi, &thread_data->td->mb);

    // Reset rtc counters.
    av1_init_rtc_counters(&thread_data->td->mb);

    thread_data->td->mb.palette_pixels = 0;

    if (thread_data->td->counts != &cpi->counts) {
      memcpy(thread_data->td->counts, &cpi->counts, sizeof(cpi->counts));
    }

    if (i > 0) {
      thread_data->td->mb.palette_buffer = thread_data->td->palette_buffer;
      thread_data->td->mb.comp_rd_buffer = thread_data->td->comp_rd_buffer;
      thread_data->td->mb.tmp_conv_dst = thread_data->td->tmp_conv_dst;
      for (int j = 0; j < 2; ++j) {
        thread_data->td->mb.tmp_pred_bufs[j] =
            thread_data->td->tmp_pred_bufs[j];
      }
      thread_data->td->mb.pixel_gradient_info =
          thread_data->td->pixel_gradient_info;

      thread_data->td->mb.src_var_info_of_4x4_sub_blocks =
          thread_data->td->src_var_info_of_4x4_sub_blocks;

      thread_data->td->mb.e_mbd.tmp_conv_dst = thread_data->td->mb.tmp_conv_dst;
      for (int j = 0; j < 2; ++j) {
        thread_data->td->mb.e_mbd.tmp_obmc_bufs[j] =
            thread_data->td->mb.tmp_pred_bufs[j];
      }
    }
  }
}